

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall
CVmObjLookupTable::set_or_add_entry(CVmObjLookupTable *this,vm_val_t *key,vm_val_t *val)

{
  vm_lookup_val *pvVar1;
  undefined8 *in_RDX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  CVmObjLookupTable *unaff_retaddr;
  vm_lookup_val *entry;
  
  pvVar1 = find_entry((CVmObjLookupTable *)val,&entry->key,(uint *)unaff_retaddr,
                      (vm_lookup_val **)in_RDI);
  if (pvVar1 == (vm_lookup_val *)0x0) {
    add_entry(unaff_retaddr,in_RDI,in_RSI);
  }
  else {
    *(undefined8 *)&pvVar1->val = *in_RDX;
    (pvVar1->val).val = *(anon_union_8_8_cb74652f_for_val *)(in_RDX + 1);
  }
  return;
}

Assistant:

void CVmObjLookupTable::set_or_add_entry(VMG_ const vm_val_t *key,
                                         const vm_val_t *val)
{
    vm_lookup_val *entry;

    /* look for an existing entry with this key */
    entry = find_entry(vmg_ key, 0, 0);

    /* if we found an existing entry, modify it; otherwise, add a new one */
    if (entry != 0)
    {   
        /* set the new value for this entry */
        entry->val = *val;
    }
    else
    {
        /* add a new entry with the given key */
        add_entry(vmg_ key, val);
    }
}